

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro256plus.hpp
# Opt level: O0

vector<trng::GF2,_256UL> * __thiscall
trng::xoshiro256plus::status_type::to_vector(status_type *this)

{
  reference pvVar1;
  long *in_RSI;
  vector<trng::GF2,_256UL> *in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  result_type mask;
  vector<trng::GF2,_256UL> *res;
  reference in_stack_ffffffffffffff78;
  vector<trng::GF2,_256UL> *in_stack_ffffffffffffff80;
  GF2 local_49;
  int local_48;
  GF2 local_41;
  int local_40;
  GF2 local_39;
  int local_38;
  GF2 local_25;
  int local_24;
  undefined8 local_20;
  undefined1 local_11;
  
  local_11 = 0;
  vector<trng::GF2,_256UL>::vector(in_RDI);
  local_20 = 0x8000000000000000;
  for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
    GF2::GF2(&local_25,SUB81((ulong)(*in_RSI << ((byte)local_24 & 0x3f)) >> 0x3f,0));
    pvVar1 = vector<trng::GF2,_256UL>::operator()
                       (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    pvVar1->value = local_25.value;
  }
  for (local_38 = 0; local_38 < 0x40; local_38 = local_38 + 1) {
    GF2::GF2(&local_39,SUB81((ulong)(in_RSI[1] << ((byte)local_38 & 0x3f)) >> 0x3f,0));
    pvVar1 = vector<trng::GF2,_256UL>::operator()
                       (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    pvVar1->value = local_39.value;
  }
  for (local_40 = 0; local_40 < 0x40; local_40 = local_40 + 1) {
    GF2::GF2(&local_41,SUB81((ulong)(in_RSI[2] << ((byte)local_40 & 0x3f)) >> 0x3f,0));
    in_stack_ffffffffffffff80 =
         (vector<trng::GF2,_256UL> *)
         vector<trng::GF2,_256UL>::operator()
                   (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    *(uint8_t *)
     &(in_stack_ffffffffffffff80->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>.
      _M_impl.super__Vector_impl_data._M_start = local_41.value;
  }
  for (local_48 = 0; local_48 < 0x40; local_48 = local_48 + 1) {
    GF2::GF2(&local_49,SUB81((ulong)(in_RSI[3] << ((byte)local_48 & 0x3f)) >> 0x3f,0));
    in_stack_ffffffffffffff78 =
         vector<trng::GF2,_256UL>::operator()
                   (in_stack_ffffffffffffff80,(size_type)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff78->value = local_49.value;
  }
  return in_RDI;
}

Assistant:

vector<GF2, 256> to_vector() const {
        vector<GF2, 256> res;
        const result_type mask{result_type(1) << 63};
        for (int i{0}; i < 64; ++i)
          res(i) = GF2(((r[0] << i) & mask) > 0);
        for (int i{0}; i < 64; ++i)
          res(i + 64) = GF2(((r[1] << i) & mask) > 0);
        for (int i{0}; i < 64; ++i)
          res(i + 2 * 64) = GF2(((r[2] << i) & mask) > 0);
        for (int i{0}; i < 64; ++i)
          res(i + 3 * 64) = GF2(((r[3] << i) & mask) > 0);
        return res;
      }